

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Matrix<double,_3,_3> *
tcu::operator*(Matrix<double,_3,_3> *__return_storage_ptr__,Matrix<double,_3,_1> *a,
              Matrix<double,_1,_3> *b)

{
  double dVar1;
  int row;
  long lVar2;
  Vector<double,_3> *pVVar3;
  Vector<double,_3> *pVVar4;
  long lVar5;
  
  Matrix<double,_3,_3>::Matrix(__return_storage_ptr__);
  pVVar3 = (Vector<double,_3> *)__return_storage_ptr__;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    dVar1 = (a->m_data).m_data[0].m_data[lVar2];
    pVVar4 = pVVar3;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      ((Vector<tcu::Vector<double,_3>,_3> *)pVVar4->m_data)->m_data[0].m_data[0] =
           (b->m_data).m_data[lVar5].m_data[0] * dVar1 + 0.0;
      pVVar4 = pVVar4 + 1;
    }
    pVVar3 = (Vector<double,_3> *)(pVVar3->m_data + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}